

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall
duckdb_re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  CharClass CVar1;
  Rune lo;
  CharClass *pCVar2;
  undefined8 uVar3;
  undefined1 auVar4 [13];
  bool foldcase;
  uint uVar5;
  Rune *pRVar6;
  undefined8 uVar7;
  ostream *this_00;
  int iVar8;
  EmptyOp empty;
  uint32_t *puVar9;
  int i;
  long lVar10;
  Rune *pRVar11;
  Frag FVar12;
  Frag FVar13;
  Frag a;
  Frag a_00;
  Frag a_01;
  Frag b;
  Frag b_00;
  Frag b_01;
  Frag b_02;
  uint32_t uStack_1c0;
  int iStack_1bc;
  Compiler local_1a8;
  
  if (this->failed_ == true) goto switchD_00ea211e_caseD_0;
  switch(re->op_) {
  case '\x01':
    goto switchD_00ea211e_caseD_0;
  case '\x02':
    goto switchD_00ea211e_caseD_1;
  case '\x03':
    FVar12 = Literal(this,(re->arguments).rune_,(bool)((byte)re->parse_flags_ & 1));
    auVar4 = FVar12._0_13_;
    break;
  case '\x04':
    iVar8 = (re->arguments).repeat.max_;
    if (iVar8 != 0) {
      uStack_1c0 = 0;
      iStack_1bc = (uint)iStack_1bc._1_3_ << 8;
      uVar7 = 0;
      for (lVar10 = 0; lVar10 < iVar8; lVar10 = lVar10 + 1) {
        FVar12 = Literal(this,*(Rune *)((long)&(((re->arguments).capture.name_)->_M_dataplus)._M_p +
                                       lVar10 * 4),(bool)((byte)re->parse_flags_ & 1));
        auVar4 = FVar12._0_13_;
        if (lVar10 != 0) {
          b_01._8_8_ = FVar12._8_8_ & 0xffffffffff;
          a_00._12_4_ = iStack_1bc;
          a_00.end.tail = uStack_1c0;
          a_00.begin = (int)uVar7;
          a_00.end.head = (int)((ulong)uVar7 >> 0x20);
          b_01.begin = (int)FVar12._0_8_;
          b_01.end.head = (int)((ulong)FVar12._0_8_ >> 0x20);
          FVar12 = Cat(this,a_00,b_01);
          auVar4 = FVar12._0_13_;
        }
        uVar7 = auVar4._0_8_;
        uStack_1c0 = auVar4._8_4_;
        iStack_1bc = CONCAT31(iStack_1bc._1_3_,auVar4[0xc]);
        iVar8 = (re->arguments).repeat.max_;
      }
      goto LAB_00ea24af;
    }
    goto switchD_00ea211e_caseD_1;
  case '\x05':
    uVar7._0_4_ = child_frags->begin;
    uVar7._4_4_ = (child_frags->end).head;
    uVar3 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar3;
    iStack_1bc = (int)((ulong)uVar3 >> 0x20);
    puVar9 = &child_frags[1].end.tail;
    for (lVar10 = 1; lVar10 < nchild_frags; lVar10 = lVar10 + 1) {
      a_01._12_4_ = iStack_1bc;
      a_01.end.tail = uStack_1c0;
      a_01.begin = (int)uVar7;
      a_01.end.head = (int)((ulong)uVar7 >> 0x20);
      b_02._8_8_ = *(undefined8 *)puVar9;
      b_02._0_8_ = *(undefined8 *)(puVar9 + -2);
      FVar12 = Cat(this,a_01,b_02);
      uVar7 = FVar12._0_8_;
      uStack_1c0 = FVar12.end.tail;
      iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar12.nullable);
      puVar9 = puVar9 + 4;
    }
    goto LAB_00ea24af;
  case '\x06':
    uVar7._0_4_ = child_frags->begin;
    uVar7._4_4_ = (child_frags->end).head;
    uVar3 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar3;
    iStack_1bc = (int)((ulong)uVar3 >> 0x20);
    puVar9 = &child_frags[1].end.tail;
    for (lVar10 = 1; lVar10 < nchild_frags; lVar10 = lVar10 + 1) {
      FVar12._12_4_ = iStack_1bc;
      FVar12.end.tail = uStack_1c0;
      FVar12.begin = (int)uVar7;
      FVar12.end.head = (int)((ulong)uVar7 >> 0x20);
      b_00._8_8_ = *(undefined8 *)puVar9;
      b_00._0_8_ = *(undefined8 *)(puVar9 + -2);
      FVar12 = Alt(this,FVar12,b_00);
      uVar7 = FVar12._0_8_;
      uStack_1c0 = FVar12.end.tail;
      iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar12.nullable);
      puVar9 = puVar9 + 4;
    }
    goto LAB_00ea24af;
  case '\a':
    FVar12 = Star(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar4 = FVar12._0_13_;
    break;
  case '\b':
    FVar12 = Plus(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar4 = FVar12._0_13_;
    break;
  case '\t':
    FVar12 = Quest(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar4 = FVar12._0_13_;
    break;
  default:
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    this_00 = std::operator<<((ostream *)&local_1a8,"Missing case in Compiler: ");
    std::ostream::operator<<(this_00,(uint)re->op_);
    goto LAB_00ea24ed;
  case '\v':
    iVar8 = (re->arguments).repeat.max_;
    if (iVar8 < 0) {
      uVar7._0_4_ = child_frags->begin;
      uVar7._4_4_ = (child_frags->end).head;
      uVar3 = *(undefined8 *)&(child_frags->end).tail;
      uStack_1c0 = (uint32_t)uVar3;
      iStack_1bc = (int)((ulong)uVar3 >> 0x20);
      goto LAB_00ea24af;
    }
    FVar12 = Capture(this,*child_frags,iVar8);
    auVar4 = FVar12._0_13_;
    break;
  case '\f':
    BeginRange(this);
    AddRuneRange(this,0,0x10ffff,false);
LAB_00ea21f4:
    uVar7._0_4_ = (this->rune_range_).begin;
    uVar7._4_4_ = (this->rune_range_).end.head;
    uVar3 = *(undefined8 *)&(this->rune_range_).end.tail;
    uStack_1c0 = (uint32_t)uVar3;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,(char)((ulong)uVar3 >> 0x20));
    goto LAB_00ea24af;
  case '\r':
    FVar12 = ByteRange(this,0,0xff,false);
    auVar4 = FVar12._0_13_;
    break;
  case '\x0e':
    empty = this->reversed_ + kEmptyBeginLine;
    goto LAB_00ea2498;
  case '\x0f':
    empty = kEmptyEndLine - this->reversed_;
    goto LAB_00ea2498;
  case '\x10':
    empty = kEmptyWordBoundary;
    goto LAB_00ea2498;
  case '\x11':
    empty = kEmptyNonWordBoundary;
    goto LAB_00ea2498;
  case '\x12':
    uVar5 = (uint)this->reversed_;
    goto LAB_00ea2491;
  case '\x13':
    uVar5 = this->reversed_ ^ 1;
LAB_00ea2491:
    empty = uVar5 * 4 + kEmptyBeginText;
LAB_00ea2498:
    FVar12 = EmptyWidth(this,empty);
    auVar4 = FVar12._0_13_;
    break;
  case '\x14':
    pCVar2 = (re->arguments).char_class.cc_;
    if (*(int *)(pCVar2 + 4) != 0) {
      CVar1 = *pCVar2;
      BeginRange(this);
      pRVar6 = *(Rune **)(pCVar2 + 8);
      for (pRVar11 = pRVar6; pRVar11 != pRVar6 + (long)*(int *)(pCVar2 + 0x10) * 2;
          pRVar11 = pRVar11 + 2) {
        lo = *pRVar11;
        if (CVar1 == (CharClass)0x0) {
LAB_00ea217f:
          if (lo < 0x42) {
LAB_00ea2184:
            uVar5 = pRVar11[1];
            if ((int)uVar5 < 0x7a) goto LAB_00ea2193;
LAB_00ea21a3:
            foldcase = false;
          }
          else {
            uVar5 = pRVar11[1];
LAB_00ea2193:
            if (0x7a < lo || (int)uVar5 < 0x41) goto LAB_00ea21a3;
            foldcase = (bool)((0x60 < uVar5 || lo < 0x5b) & (byte)CVar1);
          }
          AddRuneRange(this,lo,uVar5,foldcase);
          pRVar6 = *(Rune **)(pCVar2 + 8);
        }
        else {
          if (lo < 0x41) goto LAB_00ea2184;
          if (0x5a < pRVar11[1]) goto LAB_00ea217f;
        }
      }
      goto LAB_00ea21f4;
    }
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"No ranges in char class");
LAB_00ea24ed:
    this = &local_1a8;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
switchD_00ea211e_caseD_0:
    FVar12 = NoMatch(this);
    auVar4 = FVar12._0_13_;
    break;
  case '\x15':
    FVar12 = Match(this,(re->arguments).repeat.max_);
    uVar7 = FVar12._0_8_;
    uStack_1c0 = FVar12.end.tail;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar12.nullable);
    if (this->anchor_ != ANCHOR_BOTH) goto LAB_00ea24af;
    FVar12 = EmptyWidth(this,kEmptyEndText);
    b._12_4_ = iStack_1bc;
    b.end.tail = uStack_1c0;
    a._8_8_ = FVar12._8_8_ & 0xffffffffff;
    a.begin = (int)FVar12._0_8_;
    a.end.head = (int)((ulong)FVar12._0_8_ >> 0x20);
    b.begin = (int)uVar7;
    b.end.head = (int)((ulong)uVar7 >> 0x20);
    FVar12 = Cat(this,a,b);
    auVar4 = FVar12._0_13_;
  }
LAB_00ea24a0:
  uVar7 = auVar4._0_8_;
  uStack_1c0 = auVar4._8_4_;
  iStack_1bc = CONCAT31(iStack_1bc._1_3_,auVar4[0xc]);
LAB_00ea24af:
  FVar13._12_4_ = iStack_1bc;
  FVar13.end.tail = uStack_1c0;
  FVar13.begin = (int)uVar7;
  FVar13.end.head = (int)((ulong)uVar7 >> 0x20);
  return FVar13;
switchD_00ea211e_caseD_1:
  FVar12 = Nop(this);
  auVar4 = FVar12._0_13_;
  goto LAB_00ea24a0;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      if (anchor_ == RE2::ANCHOR_BOTH) {
        // Append \z or else the subexpression will effectively be unanchored.
        // Complemented by the UNANCHORED case in CompileSet().
        f = Cat(EmptyWidth(kEmptyEndText), f);
      }
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        failed_ = true;
        LOG(DFATAL) << "No ranges in char class";
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  failed_ = true;
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  return NoMatch();
}